

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O2

Fl_Tree_Item * __thiscall Fl_Tree::next_selected_item(Fl_Tree *this,Fl_Tree_Item *item,int dir)

{
  if (dir == 0xff52) {
    if (item != (Fl_Tree_Item *)0x0) goto LAB_001d4e98;
    for (item = last(this); item != (Fl_Tree_Item *)0x0; item = Fl_Tree_Item::prev(item)) {
      if (item->_selected != '\0') {
        return item;
      }
LAB_001d4e98:
    }
  }
  else if (dir == 0xff54) {
    if (item != (Fl_Tree_Item *)0x0) goto LAB_001d4e83;
    for (item = this->_root; item != (Fl_Tree_Item *)0x0; item = Fl_Tree_Item::next(item)) {
      if (item->_selected != '\0') {
        return item;
      }
LAB_001d4e83:
    }
  }
  return (Fl_Tree_Item *)0x0;
}

Assistant:

Fl_Tree_Item *Fl_Tree::next_selected_item(Fl_Tree_Item *item, int dir) {
  switch (dir) {
    case FL_Down:
      if ( ! item ) {
	if ( ! (item = first()) ) return(0);
	if ( item->is_selected() ) return(item);
      }
      while ( (item = item->next()) )
	if ( item->is_selected() )
	  return(item);
      return(0);
    case FL_Up:
      if ( ! item ) {
	if ( ! (item = last()) ) return(0);
	if ( item->is_selected() ) return(item);
      }
      while ( (item = item->prev()) )
	if ( item->is_selected() )
	  return(item);
      return(0);
  }
  return(0);
}